

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdUnopZero<int,double>(Thread *this,UnopFunc<int,_double> *f)

{
  int iVar1;
  int iVar2;
  Value VVar3;
  
  VVar3 = Pop(this);
  iVar1 = (*f)((double)VVar3.field_0.i64_);
  iVar2 = (*f)(VVar3.field_0._8_8_);
  VVar3.field_0.i64_._4_4_ = iVar2;
  VVar3.field_0.i32_ = iVar1;
  VVar3.field_0._8_8_ = 0;
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnopZero(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  for (u8 i = 0; i < ST::lanes; ++i) {
    result[i] = f(val[i]);
  }
  for (u8 i = ST::lanes; i < SR::lanes; ++i) {
    result[i] = 0;
  }
  Push(result);
  return RunResult::Ok;
}